

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void test_ed25519_sign(void)

{
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *pctx;
  EVP_PKEY *pkey;
  
  pctx = (EVP_PKEY_CTX *)0x0;
  ctx = EVP_PKEY_CTX_new_id(0x43f,(ENGINE *)0x0);
  EVP_PKEY_keygen_init(ctx);
  EVP_PKEY_keygen(ctx,(EVP_PKEY **)&pctx);
  EVP_PKEY_CTX_free(ctx);
  test_sign_verify((EVP_PKEY *)pctx,ed25519_signature_schemes);
  EVP_PKEY_free((EVP_PKEY *)pctx);
  return;
}

Assistant:

static void test_ed25519_sign(void)
{
#if PTLS_OPENSSL_HAVE_ED25519
    EVP_PKEY *pkey = NULL;

    { /* create pkey */
        EVP_PKEY_CTX *pctx = EVP_PKEY_CTX_new_id(EVP_PKEY_ED25519, NULL);
        EVP_PKEY_keygen_init(pctx);
        EVP_PKEY_keygen(pctx, &pkey);
        EVP_PKEY_CTX_free(pctx);
    }

    test_sign_verify(pkey, ed25519_signature_schemes);
    EVP_PKEY_free(pkey);
#endif
}